

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

bool __thiscall tinyusdz::crate::CrateReader::ReadIndex(CrateReader *this,Index *i)

{
  bool bVar1;
  ostream *poVar2;
  Index local_35c;
  string local_358;
  ostringstream local_338 [8];
  ostringstream ss_e_1;
  string local_1c0;
  ostringstream local_1a0 [8];
  ostringstream ss_e;
  uint32_t local_24;
  Index *pIStack_20;
  uint32_t value;
  Index *i_local;
  CrateReader *this_local;
  
  pIStack_20 = i;
  i_local = (Index *)this;
  bVar1 = StreamReader::read4(this->_sr,&local_24);
  if (bVar1) {
    this->_memoryUsage = this->_memoryUsage + 4;
    if ((this->_config).maxMemoryBudget < this->_memoryUsage) {
      ::std::__cxx11::ostringstream::ostringstream(local_338);
      poVar2 = ::std::operator<<((ostream *)local_338,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,"[Crate]");
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ReadIndex");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xcd);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)local_338,"Reached to max memory budget.");
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,&local_358);
      ::std::__cxx11::string::~string((string *)&local_358);
      this_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_338);
    }
    else {
      Index::Index(&local_35c,local_24);
      pIStack_20->value = local_35c.value;
      this_local._7_1_ = 1;
    }
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar2 = ::std::operator<<((ostream *)local_1a0,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ReadIndex");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xc9);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_1a0,"Failed to read Index");
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,&local_1c0);
    ::std::__cxx11::string::~string((string *)&local_1c0);
    ::std::__cxx11::ostringstream::~ostringstream(local_1a0);
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CrateReader::ReadIndex(crate::Index *i) {
  // string is serialized as StringIndex
  uint32_t value;
  if (!_sr->read4(&value)) {
    PUSH_ERROR("Failed to read Index");
    return false;
  }

  CHECK_MEMORY_USAGE(sizeof(uint32_t));

  (*i) = crate::Index(value);
  return true;
}